

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QPodArrayOps<CPP::WriteInitialization::Item*>::emplace<CPP::WriteInitialization::Item*&>
          (QPodArrayOps<CPP::WriteInitialization::Item_*> *this,qsizetype i,Item **args)

{
  undefined1 uVar1;
  qsizetype qVar2;
  Item **ppIVar3;
  undefined8 *in_RDX;
  long in_RSI;
  QArrayDataPointer<CPP::WriteInitialization::Item_*> *in_RDI;
  Item **where;
  GrowthPosition pos;
  Item *tmp;
  bool detach;
  QArrayDataPointer<CPP::WriteInitialization::Item_*> *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 uVar4;
  Item *pIVar5;
  undefined7 in_stack_ffffffffffffffe0;
  
  uVar1 = QArrayDataPointer<CPP::WriteInitialization::Item_*>::needsDetach(in_RDI);
  if (!(bool)uVar1) {
    if ((in_RSI == in_RDI->size) &&
       (qVar2 = QArrayDataPointer<CPP::WriteInitialization::Item_*>::freeSpaceAtEnd
                          (in_stack_ffffffffffffffc8), qVar2 != 0)) {
      ppIVar3 = QArrayDataPointer<CPP::WriteInitialization::Item_*>::end(in_RDI);
      *ppIVar3 = (Item *)*in_RDX;
      in_RDI->size = in_RDI->size + 1;
      return;
    }
    if ((in_RSI == 0) &&
       (qVar2 = QArrayDataPointer<CPP::WriteInitialization::Item_*>::freeSpaceAtBegin
                          (in_stack_ffffffffffffffc8), qVar2 != 0)) {
      ppIVar3 = QArrayDataPointer<CPP::WriteInitialization::Item_*>::begin
                          ((QArrayDataPointer<CPP::WriteInitialization::Item_*> *)0x168fd7);
      ppIVar3[-1] = (Item *)*in_RDX;
      in_RDI->ptr = in_RDI->ptr + -1;
      in_RDI->size = in_RDI->size + 1;
      return;
    }
  }
  pIVar5 = (Item *)*in_RDX;
  uVar4 = 0;
  if ((in_RDI->size != 0) && (in_RSI == 0)) {
    uVar4 = 1;
  }
  QArrayDataPointer<CPP::WriteInitialization::Item_*>::detachAndGrow
            ((QArrayDataPointer<CPP::WriteInitialization::Item_*> *)
             CONCAT17(uVar1,in_stack_ffffffffffffffe0),(GrowthPosition)((ulong)pIVar5 >> 0x20),
             CONCAT44(uVar4,in_stack_ffffffffffffffd0),(Item ***)in_stack_ffffffffffffffc8,in_RDI);
  ppIVar3 = QPodArrayOps<CPP::WriteInitialization::Item_*>::createHole
                      ((QPodArrayOps<CPP::WriteInitialization::Item_*> *)
                       CONCAT17(uVar1,in_stack_ffffffffffffffe0),
                       (GrowthPosition)((ulong)pIVar5 >> 0x20),
                       CONCAT44(uVar4,in_stack_ffffffffffffffd0),
                       (qsizetype)in_stack_ffffffffffffffc8);
  *ppIVar3 = pIVar5;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }